

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  CoordType CVar1;
  RenderContext *context;
  TestLog *pTVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [8];
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  long lVar8;
  size_t __n;
  Surface *pSVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  PixelFormat *format;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  ulong local_498;
  int local_490;
  int local_48c;
  ulong local_488;
  long local_480;
  CoordType local_474;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture2DView local_410;
  ConstPixelBufferAccess local_400;
  PixelBufferAccess local_3d8;
  long local_3b0;
  Texture2D *local_3a8;
  PixelBufferAccess local_3a0;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_348;
  Surface errorMask;
  undefined1 local_308 [32];
  _func_int **pp_Stack_2e8;
  BVec4 local_2e0;
  undefined1 local_2d4 [76];
  _func_int **pp_Stack_288;
  size_type local_280;
  int aiStack_278 [2];
  int local_270;
  anon_union_16_3_1194ccdc_for_v local_26c;
  undefined8 local_25c;
  LodMode local_254;
  LogImage local_240;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [21];
  
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_498 = CONCAT44(extraout_var,iVar6);
  local_3a8 = this->m_texture;
  iVar14 = (local_3a8->m_refTexture).m_width << 2;
  iVar10 = (local_3a8->m_refTexture).m_height << 2;
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar7 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar6),iVar14,iVar10,dVar7);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_2d4,TEXTURETYPE_2D);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  CVar1 = this->m_coordType;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  local_48c = viewport.width / 4;
  local_490 = viewport.height / 4;
  if ((viewport.width < iVar14 >> 1) || (viewport.height < iVar10 >> 1)) {
    this_00 = (NotSupportedError *)
              __cxa_allocate_exception(0x38,viewport.width,(long)viewport.height % 4 & 0xffffffff);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small viewport",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
               ,0x116);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1b0,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  local_270 = local_190;
  local_280 = local_1a0._M_allocated_capacity;
  aiStack_278[0] = local_1a0._8_4_;
  aiStack_278[1] = local_1a0._12_4_;
  local_2d4._68_8_ = local_1b0;
  pp_Stack_288 = pp_Stack_1a8;
  local_26c._0_8_ = local_18c[0]._0_8_;
  local_26c._8_8_ = local_18c[0]._8_8_;
  local_25c = local_18c[1]._0_8_;
  local_2d4._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_2d4._8_4_ = (uint)(CVar1 == COORDTYPE_PROJECTED) + (uint)(CVar1 == COORDTYPE_BASIC_BIAS) * 2
  ;
  local_254 = LODMODE_EXACT;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(local_498 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(local_498 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(local_498 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(local_498 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(local_498 + 0x1360))(0xde1,0x2800,0x2600);
  dVar7 = (**(code **)(local_498 + 0x800))();
  glu::checkError(dVar7,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x128);
  local_474 = CVar1;
  if (iterate()::s_projections == '\0') {
    iVar6 = __cxa_guard_acquire(&iterate()::s_projections);
    if (iVar6 != 0) {
      iterate::s_projections[0].m_data[0] = _DAT_01801430;
      iterate::s_projections[0].m_data[1] = _UNK_01801434;
      iterate::s_projections[0].m_data[2] = _UNK_01801438;
      iterate::s_projections[0].m_data[3] = _UNK_0180143c;
      iterate::s_projections[1].m_data[0] = _DAT_01801440;
      iterate::s_projections[1].m_data[1] = _UNK_01801444;
      iterate::s_projections[1].m_data[2] = _UNK_01801448;
      iterate::s_projections[1].m_data[3] = _UNK_0180144c;
      iterate::s_projections[2].m_data[0] = _DAT_01801450;
      iterate::s_projections[2].m_data[1] = _UNK_01801454;
      iterate::s_projections[2].m_data[2] = _UNK_01801458;
      iterate::s_projections[2].m_data[3] = _UNK_0180145c;
      iterate::s_projections[3].m_data[0] = _DAT_01801460;
      iterate::s_projections[3].m_data[1] = _UNK_01801464;
      iterate::s_projections[3].m_data[2] = _UNK_01801468;
      iterate::s_projections[3].m_data[3] = _UNK_0180146c;
      __cxa_guard_release(&iterate()::s_projections);
    }
  }
  uVar13 = 0;
  lVar8 = 0;
  do {
    if (lVar8 == 4) {
      context = this->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&renderedFrame);
      glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
      iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      uVar12 = this->m_minFilter;
      tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
      CVar1 = local_474;
      tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_308);
      format = (PixelFormat *)(CONCAT44(extraout_var_01,iVar6) + 8);
      lodPrec.rule = RULE_OPENGL;
      lodPrec.derivateBits = 0x16;
      lodPrec.lodBits = 0x10;
      local_308._0_4_ = 0x14;
      local_308._4_4_ = 0x14;
      local_308._8_4_ = 0;
      local_308._12_4_ = 0x10;
      local_308._16_4_ = 0x10;
      local_308._20_4_ = 0;
      local_3d8.super_ConstPixelBufferAccess.m_format.order = format->redBits;
      local_3d8.super_ConstPixelBufferAccess.m_format.type = format->greenBits;
      local_3d8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
           *(size_type *)(CONCAT44(extraout_var_01,iVar6) + 0x10);
      tcu::operator-((tcu *)&local_400,(Vector<int,_4> *)&local_3d8,
                     ((uVar12 & 0xfffffffe) == 0x2702) + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3a0,0);
      tcu::max<int,4>((tcu *)&local_240,(Vector<int,_4> *)&local_400,(Vector<int,_4> *)&local_3a0);
      tcu::computeFixedPointThreshold((tcu *)local_1b0,(IVec4 *)&local_240);
      local_308._24_8_ = local_1b0;
      pp_Stack_2e8 = pp_Stack_1a8;
      glu::TextureTestUtil::getCompareMask(format);
      auVar5 = local_1b0;
      local_2e0.m_data[0] = (bool)local_1b0[0];
      local_2e0.m_data[1] = (bool)local_1b0[1];
      local_2e0.m_data[2] = (bool)local_1b0[2];
      local_2e0.m_data[3] = (bool)local_1b0[3];
      lodPrec.derivateBits = 10;
      lodPrec.lodBits = (uint)(CVar1 != COORDTYPE_PROJECTED) * 2 + 6;
      lVar8 = 0;
      __n = 0;
      local_488 = local_488 & 0xffffffff00000000;
      local_1b0 = auVar5;
      do {
        if (__n == 4) {
          if (0 < (int)local_488) {
            local_1b0 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
            std::operator<<((ostream *)&pp_Stack_1a8,"ERROR: Image verification failed, found ");
            std::ostream::operator<<((ostringstream *)&pp_Stack_1a8,(int)local_488);
            std::operator<<((ostream *)&pp_Stack_1a8," invalid pixels!");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
          }
          pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"Result",(allocator<char> *)&local_410);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d8,"Verification result",&local_499);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_240,(string *)&local_400,(string *)&local_3d8);
          iVar6 = (int)pTVar2;
          tcu::LogImageSet::write((LogImageSet *)&local_240,iVar6,__buf,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,"Rendered",&local_49a);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,"Rendered image",&local_49b);
          pSVar9 = &renderedFrame;
          tcu::LogImage::LogImage
                    ((LogImage *)local_1b0,(string *)&local_3a0,(string *)&local_348,pSVar9,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1b0,iVar6,__buf_00,(size_t)pSVar9);
          tcu::LogImage::~LogImage((LogImage *)local_1b0);
          std::__cxx11::string::~string((string *)&local_348);
          std::__cxx11::string::~string((string *)&local_3a0);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
          std::__cxx11::string::~string((string *)&local_3d8);
          std::__cxx11::string::~string((string *)&local_400);
          if (0 < (int)local_488) {
            pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_400,"Reference",(allocator<char> *)&local_410);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d8,"Ideal reference",&local_499);
            pSVar9 = &referenceFrame;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1b0,(string *)&local_400,(string *)&local_3d8,pSVar9,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            iVar6 = (int)pTVar2;
            tcu::LogImage::write((LogImage *)local_1b0,iVar6,__buf_01,(size_t)pSVar9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a0,"ErrorMask",&local_49a);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_348,"Error mask",&local_49b);
            pSVar9 = &errorMask;
            tcu::LogImage::LogImage
                      (&local_240,(string *)&local_3a0,(string *)&local_348,pSVar9,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_240,iVar6,__buf_02,(size_t)pSVar9);
            tcu::LogImage::~LogImage(&local_240);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_3a0);
            tcu::LogImage::~LogImage((LogImage *)local_1b0);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::__cxx11::string::~string((string *)&local_400);
          }
          tcu::TestLog::endImageSet(((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
          description = "Pass";
          if ((int)local_488 != 0) {
            description = "Image verification failed";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,(uint)((int)local_488 != 0),
                     description);
          tcu::Surface::~Surface(&errorMask);
          tcu::Surface::~Surface(&referenceFrame);
          tcu::Surface::~Surface(&renderedFrame);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
          return STOP;
        }
        iVar6 = local_490 * (int)__n;
        iVar10 = 0;
        local_498 = local_498 & 0xffffffff00000000;
        local_480 = lVar8;
        local_3b0 = lVar8;
        for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
          iVar14 = viewport.width + (int)local_498;
          if (lVar11 != 0x30) {
            iVar14 = local_48c;
          }
          iVar3 = viewport.height - iVar6;
          if (__n != 3) {
            iVar3 = local_490;
          }
          CVar1 = this->m_coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_00eaa3e1:
            getBasicTexCoord2D(&texCoord,(int)local_480);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord2D(&texCoord,(int)local_480);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_00eaa3e1;
          if (local_474 == COORDTYPE_PROJECTED) {
            local_2d4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar11);
            local_2d4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar11 + 8);
          }
          else if (local_474 == COORDTYPE_BASIC_BIAS) {
            local_2d4._28_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[(uint)local_480 & 7];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    ((SurfaceAccess *)local_1b0,&referenceFrame,format,iVar10,iVar6,iVar14,iVar3);
          local_240.m_name._M_dataplus._M_p._0_4_ = (local_3a8->m_refTexture).m_view.m_numLevels;
          local_240.m_name._M_string_length = (size_type)(local_3a8->m_refTexture).m_view.m_levels;
          glu::TextureTestUtil::sampleTexture
                    ((SurfaceAccess *)local_1b0,(Texture2DView *)&local_240,
                     texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(ReferenceParams *)local_2d4);
          tcu::Surface::getAccess((PixelBufferAccess *)&local_240,&renderedFrame);
          tcu::getSubregion((PixelBufferAccess *)local_1b0,(PixelBufferAccess *)&local_240,iVar10,
                            iVar6,iVar14,iVar3);
          tcu::Surface::getAccess(&local_3d8,&referenceFrame);
          tcu::getSubregion((PixelBufferAccess *)&local_400,&local_3d8,iVar10,iVar6,iVar14,iVar3);
          tcu::Surface::getAccess(&local_348,&errorMask);
          tcu::getSubregion(&local_3a0,&local_348,iVar10,iVar6,iVar14,iVar3);
          local_410.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
          local_410.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
          iVar14 = glu::TextureTestUtil::computeTextureLookupDiff
                             ((ConstPixelBufferAccess *)local_1b0,&local_400,&local_3a0,&local_410,
                              texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,(ReferenceParams *)local_2d4,
                              (LookupPrecision *)local_308,&lodPrec,
                              ((this->super_TestCase).super_TestNode.m_testCtx)->m_watchDog);
          local_488 = CONCAT44(local_488._4_4_,(int)local_488 + iVar14);
          local_480 = local_480 + 1;
          local_498 = CONCAT44(local_498._4_4_,(int)local_498 - local_48c);
          iVar10 = iVar10 + local_48c;
        }
        __n = __n + 1;
        lVar8 = local_3b0 + 4;
      } while( true );
    }
    iVar6 = local_490 * (int)lVar8;
    iVar10 = 0;
    iVar14 = 0;
    local_488 = uVar13;
    local_480 = lVar8;
    for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
      iVar3 = viewport.width + iVar14;
      if (lVar11 != 0x30) {
        iVar3 = local_48c;
      }
      iVar4 = viewport.height - iVar6;
      if (local_480 != 3) {
        iVar4 = local_490;
      }
      CVar1 = this->m_coordType;
      uVar12 = (uint)uVar13;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_00eaa0f8:
        getBasicTexCoord2D(&texCoord,uVar12);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,uVar12);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_00eaa0f8;
      if (local_474 == COORDTYPE_PROJECTED) {
        local_2d4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar11);
        local_2d4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar11 + 8);
      }
      else if (local_474 == COORDTYPE_BASIC_BIAS) {
        local_2d4._28_4_ = Accuracy::Texture2DMipmapCase::iterate::s_bias[uVar12 & 7];
      }
      (**(code **)(local_498 + 0x1a00))(viewport.x + iVar10,viewport.y + iVar6,iVar3,iVar4);
      uVar13 = uVar13 + 1;
      iVar14 = iVar14 - local_48c;
      iVar10 = iVar10 + local_48c;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_2d4);
    }
    lVar8 = local_480 + 1;
    uVar13 = local_488 + 4;
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();

	const deUint32				magFilter			= GL_NEAREST;
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();
	const int					defViewportWidth	= texWidth*4;
	const int					defViewportHeight	= texHeight*4;

	const RandomViewport		viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Bail out if rendertarget is too small.
	if (viewport.width < defViewportWidth/2 || viewport.height < defViewportHeight/2)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	sampleParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}